

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_tzx.cpp
# Opt level: O0

void TZX_AppendPauseBlock(path *fname,uint16_t pauseAfterMs)

{
  char *badValueMessage;
  string local_40;
  FILE *local_20;
  FILE *ff;
  path *ppStack_10;
  uint16_t pauseAfterMs_local;
  path *fname_local;
  
  ff._6_2_ = pauseAfterMs;
  ppStack_10 = fname;
  local_20 = (FILE *)SJ_fopen(fname,"a+b");
  if (local_20 == (FILE *)0x0) {
    std::filesystem::__cxx11::path::string(&local_40,ppStack_10);
    badValueMessage = (char *)std::__cxx11::string::c_str();
    Error("[TZX] Error opening file for append",badValueMessage,FATAL);
    std::__cxx11::string::~string((string *)&local_40);
  }
  fputc(0x20,local_20);
  fputc(ff._6_2_ & 0xff,local_20);
  fputc((int)(uint)ff._6_2_ >> 8,local_20);
  fclose(local_20);
  return;
}

Assistant:

void TZX_AppendPauseBlock(const std::filesystem::path & fname, uint16_t pauseAfterMs)
{
	FILE* ff;
	if (!FOPEN_ISOK(ff, fname, "a+b")) {
		Error("[TZX] Error opening file for append", fname.string().c_str(), FATAL);
	}
	fputc(TZXBlockId::Pause, ff); // block id

	fputc(pauseAfterMs & 0xFF, ff);
	fputc(pauseAfterMs >> 8, ff);
	fclose(ff);
}